

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  int iVar2;
  int iVar3;
  stbrp_node *psVar4;
  int *piVar5;
  int *piVar6;
  stbrp_context *psVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  stbrp_node **ppsVar11;
  stbrp_node *psVar12;
  stbrp_node *compare_func;
  long lVar13;
  int *pwaste;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  stbrp_context *psVar18;
  stbrp_node **ppsVar19;
  stbrp_context *c;
  int *piStack_a0;
  uint local_98;
  int local_94;
  stbrp_node **local_90;
  int local_58;
  int waste;
  stbrp_node **local_50;
  size_t local_48;
  stbrp_rect *local_40;
  ulong local_38;
  
  uVar10 = 0;
  uVar17 = 0;
  if (0 < num_rects) {
    uVar17 = (ulong)(uint)num_rects;
  }
  compare_func = (stbrp_node *)&rects->was_packed;
  for (; uVar17 != uVar10; uVar10 = uVar10 + 1) {
    compare_func->x = (int)uVar10;
    compare_func = (stbrp_node *)((long)compare_func + 0x18);
  }
  local_48 = (size_t)num_rects;
  ImQsort(rects,local_48,0x1e6c82,(_func_int_void_ptr_void_ptr *)compare_func);
  local_50 = &context->active_head;
  uVar10 = 0;
  local_40 = rects;
  while( true ) {
    pwaste = (int *)0xc;
    if (uVar10 == uVar17) break;
    psVar1 = rects + uVar10;
    uVar14 = rects[uVar10].w;
    piStack_a0 = (int *)0x10;
    if (uVar14 == 0) {
      uVar8 = 0;
      uVar9 = 0;
    }
    else {
      iVar16 = psVar1->h;
      uVar8 = 0;
      uVar9 = 0;
      if (iVar16 != 0) {
        iVar2 = context->width;
        uVar8 = context->align;
        iVar15 = uVar14 + uVar8 + -1;
        iVar15 = iVar15 - iVar15 % (int)uVar8;
        local_38 = (ulong)uVar14;
        if ((iVar2 < iVar15) || (iVar3 = context->height, iVar3 < iVar16)) {
          piStack_a0 = (int *)0x10;
          compare_func = (stbrp_node *)(ulong)uVar8;
          pwaste = (int *)0xc;
          uVar8 = 0x7fffffff;
          uVar9 = 0x7fffffff;
        }
        else {
          c = (stbrp_context *)*local_50;
          local_94 = 0x40000000;
          uVar14 = 0x40000000;
          local_90 = (stbrp_node **)0x0;
          ppsVar19 = local_50;
          for (psVar18 = c; psVar18->width + iVar15 <= iVar2;
              psVar18 = *(stbrp_context **)&psVar18->align) {
            uVar8 = stbrp__skyline_find_min_y
                              (psVar18,(stbrp_node *)(ulong)(uint)psVar18->width,iVar15,(int)&waste,
                               pwaste);
            if (context->heuristic == 0) {
              if ((int)uVar8 < (int)uVar14) {
                uVar14 = uVar8;
                local_90 = ppsVar19;
              }
            }
            else if (((int)(iVar16 + uVar8) <= iVar3) &&
                    (((int)uVar8 < (int)uVar14 || (waste < local_94 && uVar8 == uVar14)))) {
              local_94 = waste;
              uVar14 = uVar8;
              local_90 = ppsVar19;
            }
            ppsVar19 = (stbrp_node **)&psVar18->align;
          }
          if (local_90 == (stbrp_node **)0x0) {
            local_98 = 0;
          }
          else {
            local_98 = (*local_90)->x;
          }
          psVar18 = c;
          if (context->heuristic == 1) {
            for (; ppsVar19 = local_50, psVar18->width < iVar15;
                psVar18 = *(stbrp_context **)&psVar18->align) {
            }
            for (; psVar18 != (stbrp_context *)0x0; psVar18 = *(stbrp_context **)&psVar18->align) {
              uVar8 = psVar18->width - iVar15;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar11 = ppsVar19;
                ppsVar19 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((*(stbrp_context **)&c->align)->width <= (int)uVar8);
              uVar9 = stbrp__skyline_find_min_y
                                (c,(stbrp_node *)(ulong)uVar8,iVar15,(int)&local_58,pwaste);
              if ((((int)(iVar16 + uVar9) <= iVar3) && ((int)uVar9 <= (int)uVar14)) &&
                 (((uVar9 < uVar14 || (local_58 < local_94)) ||
                  ((local_58 == local_94 && ((int)uVar8 < (int)local_98)))))) {
                local_94 = local_58;
                uVar14 = uVar9;
                local_98 = uVar8;
                local_90 = ppsVar11;
              }
              ppsVar19 = ppsVar11;
            }
          }
          piStack_a0 = (int *)0xc;
          pwaste = piStack_a0;
          piVar5 = (int *)0xc;
          piStack_a0 = (int *)0x10;
          piVar6 = (int *)0x10;
          rects = local_40;
          uVar8 = 0x7fffffff;
          if ((local_90 == (stbrp_node **)0x0) || (iVar3 < (int)(iVar16 + uVar14))) {
            compare_func = (stbrp_node *)local_90;
            uVar9 = 0x7fffffff;
          }
          else {
            compare_func = context->free_head;
            piStack_a0 = piVar6;
            pwaste = piVar5;
            uVar9 = 0x7fffffff;
            if (compare_func != (stbrp_node *)0x0) {
              compare_func->x = local_98;
              compare_func->y = iVar16 + uVar14;
              context->free_head = compare_func->next;
              psVar4 = *local_90;
              psVar12 = psVar4;
              if (psVar4->x < (int)local_98) {
                psVar12 = psVar4->next;
                local_90 = &psVar4->next;
              }
              *local_90 = compare_func;
              iVar16 = (int)local_38 + local_98;
              while ((psVar4 = psVar12->next, psVar4 != (stbrp_node *)0x0 && (psVar4->x <= iVar16)))
              {
                psVar12->next = context->free_head;
                context->free_head = psVar12;
                psVar12 = psVar4;
              }
              compare_func->next = psVar12;
              piStack_a0 = piVar5;
              pwaste = piVar6;
              uVar8 = local_98;
              uVar9 = uVar14;
              if (psVar12->x < iVar16) {
                psVar12->x = iVar16;
              }
            }
          }
        }
      }
    }
    *(uint *)((long)&psVar1->id + (long)piStack_a0) = uVar8;
    *(uint *)((long)&psVar1->id + (long)pwaste) = uVar9;
    uVar10 = uVar10 + 1;
  }
  ImQsort(rects,local_48,0x1e6ca6,(_func_int_void_ptr_void_ptr *)compare_func);
  for (lVar13 = 0; uVar17 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    uVar14 = 1;
    if (*(int *)((long)&rects->x + lVar13) == 0x7fffffff) {
      uVar14 = (uint)(*(int *)((long)&rects->y + lVar13) != 0x7fffffff);
    }
    *(uint *)((long)&rects->was_packed + lVar13) = uVar14;
  }
  return (int)(uVar17 * 0x18);
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}